

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqCommsSS::queue_tx_function(ZmqCommsSS *this)

{
  string_view message;
  string_view message_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  __int_type _Var5;
  uint uVar6;
  int iVar7;
  pair<helics::route_id,_helics::ActionMessage> *ppVar8;
  char *pcVar9;
  size_type sVar10;
  socket_t *__n;
  reference pvVar11;
  reference ppsVar12;
  context_t *context_;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  int __timeout;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar13;
  undefined8 extraout_RDX_08;
  int *__rep;
  long in_RDI;
  ulong uVar14;
  __sv_type _Var15;
  string empty_1;
  string route_name;
  iterator rt_find;
  string empty;
  bool close_tx;
  bool processed;
  int tx_count;
  int rc;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> tx_msg;
  int count;
  ActionMessage cmd;
  route_id rid;
  bool haltLoop;
  int status;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> sockets;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  int res;
  socket_t brokerConnection;
  socket_t brokerSocket;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connection_info;
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  routes;
  message_t msg;
  shared_ptr<ZmqContextManager> ctx;
  vector<char,_std::allocator<char>_> buffer;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  ConnectionStatus in_stack_fffffffffffff9a0;
  uint in_stack_fffffffffffff9a4;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff9a8;
  ConnectionStatus status_00;
  CommsInterface *in_stack_fffffffffffff9b0;
  context_t *in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  int in_stack_fffffffffffff9d0;
  uint in_stack_fffffffffffff9d4;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  socket_t *in_stack_fffffffffffff9f8;
  socket_t *in_stack_fffffffffffffa00;
  string *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  socket_t *in_stack_fffffffffffffa18;
  iterator in_stack_fffffffffffffa20;
  socket_t *in_stack_fffffffffffffa48;
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa50;
  undefined6 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5e;
  undefined1 uVar16;
  socket_t *in_stack_fffffffffffffa68;
  socket_t *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  int local_554;
  duration<long,std::ratio<1l,1000l>> local_550 [8];
  undefined1 local_548 [248];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 local_408;
  const_buffer local_3e8;
  socket_t *local_3d8;
  const_buffer local_3c8;
  undefined1 local_3b8 [24];
  ActionMessage *in_stack_fffffffffffffc60;
  undefined1 local_398 [24];
  socket_t *in_stack_fffffffffffffc80;
  iterator in_stack_fffffffffffffc88;
  _Self local_370;
  undefined4 local_364;
  value_type local_360;
  socket_t *local_350;
  undefined1 in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcb9;
  value_type in_stack_fffffffffffffcc0;
  ZmqCommsSS *in_stack_fffffffffffffcc8;
  int local_300;
  int local_2fc;
  int local_22c;
  socket_t local_228 [11];
  route_id local_170;
  byte local_169;
  int local_168;
  allocator<zmq::socket_t_*> local_161;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> local_160;
  allocator<zmq_pollitem_t> local_141;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> local_140;
  undefined4 local_128;
  int local_124;
  undefined1 local_120 [16];
  socket_t local_110;
  socket_t local_100 [6];
  socket_t local_a0 [8];
  
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x4c529c);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  ZmqContextManager::getContextPointer(in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  zmq::message_t::message_t
            ((message_t *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4c52f6);
  if (!bVar2) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               (bool)in_stack_fffffffffffff99f);
  }
  std::
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4c5348);
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4c5355);
  if (*(int *)(in_RDI + 0x410) < 0) {
    iVar4 = getDefaultBrokerPort((ZmqCommsSS *)0x4c5373);
    *(int *)(in_RDI + 0x410) = iVar4;
  }
  _Var5 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffff9a8);
  if (_Var5 < 0) {
    getDefaultBrokerPort((ZmqCommsSS *)0x4c53d2);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
  }
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4c5403);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4c540b);
  zmq::socket_t::socket_t
            ((socket_t *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4c543e);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4c5446);
  zmq::socket_t::socket_t
            ((socket_t *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
  iVar4 = (int)local_120 + 0x10;
  local_124 = initializeBrokerConnections
                        ((ZmqCommsSS *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                         ,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  if (local_124 < 0) {
    iVar4 = 4;
    CommsInterface::setTxStatus
              (in_stack_fffffffffffff9b0,
               (ConnectionStatus)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    zmq::socket_t::close((socket_t *)(local_120 + 0x10),iVar4);
    zmq::socket_t::close((socket_t *)local_120,iVar4);
    local_128 = 1;
  }
  else {
    if ((*(byte *)(in_RDI + 0x25b) & 1) == 0) {
      zmq::socket_t::close((socket_t *)(local_120 + 0x10),iVar4);
    }
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8);
    if (!bVar2) {
      zmq::socket_t::close((socket_t *)local_120,iVar4);
      CommsInterface::setTxStatus
                (in_stack_fffffffffffff9b0,
                 (ConnectionStatus)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    }
    std::allocator<zmq_pollitem_t>::allocator((allocator<zmq_pollitem_t> *)0x4c5585);
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::vector
              ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (size_type)in_stack_fffffffffffff9b8,(allocator_type *)in_stack_fffffffffffff9b0);
    std::allocator<zmq_pollitem_t>::~allocator(&local_141);
    std::allocator<zmq::socket_t_*>::allocator((allocator<zmq::socket_t_*> *)0x4c55c3);
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::vector
              ((vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *)
               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (size_type)in_stack_fffffffffffff9b8,(allocator_type *)in_stack_fffffffffffff9b0);
    std::allocator<zmq::socket_t_*>::~allocator(&local_161);
    uVar6 = (uint)*(byte *)(in_RDI + 0x25b);
    std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8);
    uVar14 = (ulong)(uVar6 & 1);
    __n = (socket_t *)local_120;
    loadPoller((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
               CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *)
               in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (bool)in_stack_fffffffffffff9f7,(bool)in_stack_fffffffffffff9f6);
    local_408 = (value_type)0x0;
    CommsInterface::setRxStatus
              (in_stack_fffffffffffff9b0,
               (ConnectionStatus)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_168 = 0;
    local_169 = 0;
    while (iVar4 = (int)local_408, ((local_169 ^ 0xff) & 1) != 0) {
      route_id::route_id(&local_170);
      ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffff9b0);
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::try_pop(in_stack_fffffffffffff9d8);
      local_408 = (value_type)0x0;
      iVar7 = zmq::poll((pollfd *)&local_140,0,__timeout);
      iVar4 = iVar7;
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x4c56f6);
      if ((!bVar2) || (iVar7 < 1)) {
        std::this_thread::yield();
      }
      local_300 = 0;
      while( true ) {
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x4c57c3
                          );
        __n = (socket_t *)CONCAT71((int7)((ulong)__n >> 8),bVar2);
        uVar16 = bVar2 && local_300 < 0x14;
        uVar13 = extraout_RDX;
        if (!bVar2 || local_300 >= 0x14) break;
        bVar2 = false;
        ppVar8 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                           ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                            0x4c580c);
        local_408 = &ppVar8->second;
        ActionMessage::operator=
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   (ActionMessage *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
        ppVar8 = std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator->
                           ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                            0x4c582d);
        local_170.rid = (ppVar8->first).rid;
        bVar3 = isProtocolCommand((ActionMessage *)
                                  CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
        if (bVar3) {
          local_408 = (value_type)0xffffffff;
          bVar3 = route_id::operator==(&local_170,(route_id)0xffffffff);
          if (bVar3) {
            bVar2 = true;
            local_408 = local_228;
            __n = local_100;
            in_stack_fffffffffffffa5e =
                 processTxControlCmd((ZmqCommsSS *)CONCAT44(uVar6,iVar4),
                                     (ActionMessage *)
                                     CONCAT17(uVar16,CONCAT16(in_stack_fffffffffffffa5e,
                                                              in_stack_fffffffffffffa58)),
                                     in_stack_fffffffffffffa50,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_fffffffffffffa48);
            if ((bool)in_stack_fffffffffffffa5e) {
              local_169 = 1;
              uVar13 = extraout_RDX_00;
              break;
            }
          }
        }
        if (!bVar2) {
          in_stack_fffffffffffffa50 =
               (map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&stack0xffffffffffffffe0;
          std::vector<char,_std::allocator<char>_>::clear
                    ((vector<char,_std::allocator<char>_> *)0x4c58f7);
          ActionMessage::to_vector
                    ((ActionMessage *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
          bVar2 = route_id::operator==(&local_170,(route_id)0x0);
          if (bVar2) {
            bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8);
            if (bVar2) {
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9b0);
              pcVar9 = CLI::std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x4c5977);
              sVar10 = CLI::std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffffe0);
              local_408 = in_stack_fffffffffffffcc0;
              zmq::const_buffer::const_buffer
                        ((const_buffer *)&stack0xfffffffffffffcc0,pcVar9,sVar10);
              in_stack_fffffffffffffcc0 = (value_type)local_408;
              __n = (socket_t *)
                    zmq::detail::socket_base::send
                              ((socket_base *)local_120,(int)local_408,in_stack_fffffffffffffcc8,1,
                               (int)uVar14);
              in_stack_fffffffffffffa48 = __n;
              local_350 = __n;
              in_stack_fffffffffffffcb8 = extraout_DL;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
            }
            else {
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
              message._M_str = (char *)in_stack_fffffffffffffa20._M_node;
              message._M_len = (size_t)in_stack_fffffffffffffa18;
              local_408 = local_360;
              CommsInterface::logWarning
                        ((CommsInterface *)
                         CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),message);
            }
          }
          else {
            local_364 = 0xffffffff;
            bVar2 = route_id::operator==(&local_170,(route_id)0xffffffff);
            if (bVar2) {
              local_408 = local_a0;
              local_168 = processIncomingMessage
                                    (in_stack_fffffffffffffcc8,
                                     (message_t *)in_stack_fffffffffffffcc0,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT71(in_stack_fffffffffffffcb9,in_stack_fffffffffffffcb8
                                                ));
              if (local_168 < 0) {
                local_169 = 1;
                uVar13 = extraout_RDX_01;
                break;
              }
            }
            else {
              in_stack_fffffffffffffa20 =
                   std::
                   map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
                          (key_type *)0x4c5af0);
              local_370._M_node = in_stack_fffffffffffffa20._M_node;
              in_stack_fffffffffffffc88 =
                   std::
                   map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
              local_408 = &stack0xfffffffffffffc88;
              bVar2 = std::operator==(&local_370,(_Self *)local_408);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                bVar2 = std::atomic::operator_cast_to_bool
                                  ((atomic<bool> *)in_stack_fffffffffffff9a8);
                if (bVar2) {
                  in_stack_fffffffffffff9e0 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffffe0;
                  pcVar9 = CLI::std::vector<char,_std::allocator<char>_>::data
                                     ((vector<char,_std::allocator<char>_> *)0x4c5ca9);
                  sVar10 = CLI::std::vector<char,_std::allocator<char>_>::size
                                     ((vector<char,_std::allocator<char>_> *)
                                      in_stack_fffffffffffff9e0);
                  zmq::const_buffer::const_buffer(&local_3e8,pcVar9,sVar10);
                  local_408 = local_3e8._data;
                  __n = (socket_t *)
                        zmq::detail::socket_base::send
                                  ((socket_base *)local_120,(int)local_3e8._data,
                                   (void *)local_3e8._size,1,(int)uVar14);
                  in_stack_fffffffffffff9f7 = extraout_DL_01;
                  in_stack_fffffffffffff9f8 = __n;
                }
                else {
                  bVar2 = isIgnoreableCommand((ActionMessage *)
                                              CONCAT17(in_stack_fffffffffffff99f,
                                                       in_stack_fffffffffffff998));
                  if (!bVar2) {
                    in_stack_fffffffffffff9d8 =
                         (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                          *)&stack0xfffffffffffffbb7;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,
                               (allocator<char> *)
                               CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
                    prettyPrintString_abi_cxx11_(in_stack_fffffffffffffc60);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff9d8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0))
                    ;
                    _Var15 = std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff9a4,
                                                    in_stack_fffffffffffff9a0));
                    local_408 = _Var15._M_len;
                    message_00._M_str = (char *)in_stack_fffffffffffffa20._M_node;
                    message_00._M_len = (size_t)in_stack_fffffffffffffa18;
                    CommsInterface::logWarning
                              ((CommsInterface *)
                               CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                               message_00);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
                    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb7);
                  }
                }
              }
              else {
                std::
                _Rb_tree_iterator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x4c5b4c);
                std::__cxx11::string::string
                          (in_stack_fffffffffffff9e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9d8);
                std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9b0);
                zmq::detail::socket_base::send
                          ((socket_base *)(local_120 + 0x10),(int)local_398,(void *)0x2,(size_t)__n,
                           (int)uVar14);
                zmq::detail::socket_base::send
                          ((socket_base *)(local_120 + 0x10),(int)local_3b8,(void *)0x2,(size_t)__n,
                           (int)uVar14);
                in_stack_fffffffffffffa00 = (socket_t *)&stack0xffffffffffffffe0;
                in_stack_fffffffffffffa08 =
                     (string *)
                     CLI::std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x4c5bb9);
                sVar10 = CLI::std::vector<char,_std::allocator<char>_>::size
                                   ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa00
                                   );
                zmq::const_buffer::const_buffer(&local_3c8,in_stack_fffffffffffffa08,sVar10);
                local_408 = local_3c8._data;
                __n = (socket_t *)
                      zmq::detail::socket_base::send
                                ((socket_base *)(local_120 + 0x10),(int)local_3c8._data,
                                 (void *)local_3c8._size,1,(int)uVar14);
                in_stack_fffffffffffffa17 = extraout_DL_00;
                in_stack_fffffffffffffa18 = __n;
                local_3d8 = __n;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
              }
            }
          }
        }
        local_300 = local_300 + 1;
        if (local_300 < 0x14) {
          gmlc::containers::
          BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
          ::try_pop(in_stack_fffffffffffff9d8);
          local_408 = local_548 + 0x10;
          std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator=
                    ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     (optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
          std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
                    ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x4c5ef8);
        }
      }
      local_22c = 0;
      local_2fc = 1;
      while( true ) {
        uVar1 = in_stack_fffffffffffff9d4 & 0xffffff;
        if (0 < local_2fc) {
          uVar1 = CONCAT13(local_22c < 5,(int3)in_stack_fffffffffffff9d4);
        }
        in_stack_fffffffffffff9d4 = uVar1;
        if ((char)(in_stack_fffffffffffff9d4 >> 0x18) == '\0') break;
        local_408 = (value_type)0x0;
        local_2fc = zmq::poll((pollfd *)&local_140,0,(int)uVar13);
        uVar13 = extraout_RDX_02;
        in_stack_fffffffffffff9d0 = local_2fc;
        if (0 < local_2fc) {
          local_408 = (value_type)0x0;
          pvVar11 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                              (&local_140,0);
          bVar2 = zmq::has_message(pvVar11);
          uVar13 = extraout_RDX_03;
          if (bVar2) {
            ppsVar12 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[]
                                 (&local_160,0);
            local_408 = *ppsVar12;
            local_168 = processRxMessage((ZmqCommsSS *)in_stack_fffffffffffffbc0,
                                         (socket_t *)in_stack_fffffffffffffbb8,
                                         in_stack_fffffffffffffbb0);
            uVar13 = extraout_RDX_04;
          }
          if (((*(byte *)(in_RDI + 0x25b) & 1) != 0) &&
             (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8),
             uVar13 = extraout_RDX_05, bVar2)) {
            local_408 = (value_type)0x1;
            pvVar11 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                                (&local_140,1);
            bVar2 = zmq::has_message(pvVar11);
            in_stack_fffffffffffff9c4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff9c4);
            uVar13 = extraout_RDX_06;
            if (bVar2) {
              ppsVar12 = std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::operator[]
                                   (&local_160,1);
              local_408 = *ppsVar12;
              in_stack_fffffffffffff9c0 =
                   processRxMessage((ZmqCommsSS *)in_stack_fffffffffffffbc0,
                                    (socket_t *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0)
              ;
              uVar13 = extraout_RDX_07;
              local_168 = in_stack_fffffffffffff9c0;
            }
          }
          if (local_168 < 0) {
            local_169 = 1;
          }
          if (local_168 == 5) {
            zmq::socket_t::close((socket_t *)local_120,(int)local_408);
            iVar4 = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
            std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4c60a2);
            context_ = ZmqContextManager::getBaseContext((ZmqContextManager *)0x4c60aa);
            zmq::socket_t::socket_t
                      ((socket_t *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       context_,iVar4);
            in_stack_fffffffffffff9b0 = (CommsInterface *)local_120;
            in_stack_fffffffffffff9a8 = (vector<char,_std::allocator<char>_> *)local_548;
            zmq::socket_t::operator=
                      ((socket_t *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       (socket_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
            zmq::socket_t::~socket_t((socket_t *)0x4c60f3);
            initializeConnectionToBroker
                      ((ZmqCommsSS *)in_stack_fffffffffffffc88._M_node,in_stack_fffffffffffffc80);
            in_stack_fffffffffffff9a4 = (uint)*(byte *)(in_RDI + 0x25b);
            std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8);
            uVar14 = (ulong)(in_stack_fffffffffffff9a4 & 1);
            local_408 = &local_160;
            __n = (socket_t *)local_120;
            loadPoller((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                       CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                       (vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *)
                       in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8
                       ,(bool)in_stack_fffffffffffff9f7,(bool)in_stack_fffffffffffff9f6);
            uVar13 = extraout_RDX_08;
          }
        }
        local_22c = local_22c + 1;
      }
      std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
                ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x4c6184);
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    }
    std::
    map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x4c61c2);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x4c61cf);
    if ((*(byte *)(in_RDI + 0x25b) & 1) != 0) {
      local_554 = 0x32;
      __rep = &local_554;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_550,__rep);
      iVar4 = (int)__rep;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff9e0);
      zmq::socket_t::close((socket_t *)(local_120 + 0x10),iVar4);
    }
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9a8);
    status_00 = (ConnectionStatus)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (bVar2) {
      zmq::socket_t::close((socket_t *)local_120,iVar4);
    }
    CommsInterface::setTxStatus(in_stack_fffffffffffff9b0,status_00);
    in_stack_fffffffffffff9a0 = CommsInterface::getRxStatus((CommsInterface *)0x4c6266);
    if (in_stack_fffffffffffff9a0 == CONNECTED) {
      CommsInterface::setRxStatus(in_stack_fffffffffffff9b0,status_00);
    }
    std::vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>::~vector
              ((vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *)
               in_stack_fffffffffffff9b0);
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~vector
              ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)in_stack_fffffffffffff9b0)
    ;
    local_128 = 0;
  }
  zmq::socket_t::~socket_t((socket_t *)0x4c62bd);
  zmq::socket_t::~socket_t((socket_t *)0x4c62ca);
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4c62d7);
  std::
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4c62e4);
  zmq::message_t::~message_t
            ((message_t *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4c62fe);
  CLI::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9b0);
  return;
}

Assistant:

void ZmqCommsSS::queue_tx_function()
{
    std::vector<char> buffer;
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::message_t msg;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }

    // contains mapping between route id and core name
    std::map<route_id, std::string> routes;
    // contains mapping between core name and address
    std::map<std::string, std::string> connection_info;

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    if (PortNumber < 0) {
        PortNumber = getDefaultBrokerPort();
    }
    zmq::socket_t brokerSocket(ctx->getBaseContext(), ZMQ_ROUTER);
    zmq::socket_t brokerConnection(ctx->getBaseContext(), ZMQ_DEALER);
    auto res = initializeBrokerConnections(brokerSocket, brokerConnection);
    if (res < 0) {
        setTxStatus(ConnectionStatus::ERRORED);
        brokerSocket.close();
        brokerConnection.close();
        return;
    }
    // Root broker is set
    if (!serverMode) {
        brokerSocket.close();
    }
    if (!hasBroker) {
        brokerConnection.close();
        setTxStatus(ConnectionStatus::CONNECTED);
    }
    // setTxStatus(ConnectionStatus::CONNECTED);

    std::vector<zmq::pollitem_t> poller(2);
    std::vector<zmq::socket_t*> sockets(2);
    loadPoller(poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);

    setRxStatus(ConnectionStatus::CONNECTED);

    int status{0};

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;
        int count{0};

        // Handle Tx messages first
        auto tx_msg = txQueue.try_pop();
        int rc = zmq::poll(poller, 0L);
        if (!tx_msg || (rc <= 0)) {
            std::this_thread::yield();
        }
        int tx_count{0};
        // Balance between tx and rx processing since both running on single thread
        while (tx_msg && (tx_count < TX_RX_MSG_COUNT)) {
            bool processed{false};
            cmd = std::move(tx_msg->second);
            rid = tx_msg->first;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    processed = true;
                    auto close_tx = processTxControlCmd(cmd, routes, connection_info);

                    if (close_tx) {
                        haltLoop = true;
                        break;
                    }
                }
            }
            if (!processed) {
                buffer.clear();
                cmd.to_vector(buffer);
                if (rid == parent_route_id) {
                    if (hasBroker) {
                        std::string empty;
                        brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                              zmq::send_flags::dontwait);
                    } else {
                        logWarning("no route to broker for message");
                    }
                } else if (rid == control_route) {
                    status = processIncomingMessage(msg, connection_info);  //----------> ToCheck
                    if (status < 0) {
                        haltLoop = true;
                        break;
                    }
                } else {
                    // If route found send out through the front end socket connection
                    auto rt_find = routes.find(rid);
                    if (rt_find != routes.end()) {
                        std::string route_name = rt_find->second;
                        std::string empty;
                        // Need to first send identity and empty string
                        brokerSocket.send(route_name, zmq::send_flags::sndmore);
                        brokerSocket.send(empty, zmq::send_flags::sndmore);
                        // Send the actual data
                        brokerSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                          zmq::send_flags::dontwait);
                    } else {
                        if (hasBroker) {
                            brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                                  zmq::send_flags::dontwait);
                        } else {
                            if (!isIgnoreableCommand(cmd)) {
                                logWarning(
                                    std::string("unknown route and no broker, dropping message ") +
                                    prettyPrintString(cmd));
                            }
                        }
                    }
                }
            }
            tx_count++;
            if (tx_count < TX_RX_MSG_COUNT) {
                tx_msg = txQueue.try_pop();
            }
        }

        count = 0;
        rc = 1;
        while ((rc > 0) && (count < 5)) {
            rc = zmq::poll(poller, 0L);

            if (rc > 0) {
                if (zmq::has_message(poller[0])) {
                    status = processRxMessage(*sockets[0], connection_info);
                }
                if (serverMode && hasBroker) {
                    if (zmq::has_message(poller[1])) {
                        status = processRxMessage(*sockets[1], connection_info);
                    }
                }

                if (status < 0) {
                    haltLoop = true;
                }
                if (status == 5) {
                    brokerConnection.close();
                    brokerConnection = zmq::socket_t(ctx->getBaseContext(), ZMQ_DEALER);
                    initializeConnectionToBroker(brokerConnection);
                    loadPoller(
                        poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);
                }
            }
            count++;
        }
    }
    routes.clear();
    connection_info.clear();
    if (serverMode) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        brokerSocket.close();
    }
    if (hasBroker) {
        brokerConnection.close();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}